

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_column_reader.hpp
# Opt level: O2

void __thiscall
duckdb::NullColumnReader::Plain
          (NullColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  bool bVar1;
  
  FlatVector::VerifyFlatVector(result);
  while (bVar1 = num_values != 0, num_values = num_values - 1, bVar1) {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&(result->validity).super_TemplatedValidityMask<unsigned_long>,result_offset);
    result_offset = result_offset + 1;
  }
  return;
}

Assistant:

void Plain(ByteBuffer &plain_data, uint8_t *defines, uint64_t num_values, idx_t result_offset,
	           Vector &result) override {
		(void)defines;
		(void)plain_data;

		auto &result_mask = FlatVector::Validity(result);
		for (idx_t row_idx = 0; row_idx < num_values; row_idx++) {
			result_mask.SetInvalid(row_idx + result_offset);
		}
	}